

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O2

string * toString(string *__return_storage_ptr__,ArgInfo *argInfo,string *indent)

{
  ostream *poVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string desc;
  string replace;
  string name;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__cxx11::string::string((string *)&name,(string *)(argInfo + 0x40));
  if (*(long *)(argInfo + 0x48) == 0) {
    std::__cxx11::string::_M_assign((string *)&name);
  }
  poVar1 = std::operator<<(local_1a8,(string *)indent);
  poVar1 = std::operator<<(poVar1," * ");
  std::operator<<(poVar1,(string *)&name);
  std::__cxx11::string::string((string *)&desc,(string *)(argInfo + 0x60));
  std::operator+(&local_238,"\n",indent);
  std::operator+(&replace,&local_238,"   ");
  std::__cxx11::string::~string((string *)&local_238);
  while( true ) {
    uVar2 = std::__cxx11::string::find((char *)&desc,0x10b686);
    if (uVar2 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)&desc,uVar2,(string *)0x1);
  }
  if (desc._M_string_length != 0) {
    poVar1 = std::operator<<(local_1a8," - ");
    poVar1 = std::operator<<(poVar1,(string *)&desc);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,(string *)indent);
    std::operator<<(poVar1,"  ");
  }
  poVar1 = std::operator<<(local_1a8," [key=");
  std::operator<<(poVar1,(string *)argInfo);
  if (*(long *)(argInfo + 0x88) != 0) {
    poVar1 = std::operator<<(local_1a8,", units=");
    std::operator<<(poVar1,(string *)(argInfo + 0x80));
  }
  if (*(long *)(argInfo + 0x28) != 0) {
    poVar1 = std::operator<<(local_1a8,", default=");
    std::operator<<(poVar1,(string *)(argInfo + 0x20));
  }
  if ((ulong)*(uint *)(argInfo + 0xa0) < 4) {
    std::operator<<(local_1a8,
                    &DAT_0010b928 + *(int *)(&DAT_0010b928 + (ulong)*(uint *)(argInfo + 0xa0) * 4));
  }
  if (*(double *)(argInfo + 0xa8) <= *(double *)(argInfo + 0xb0) &&
      *(double *)(argInfo + 0xb0) != *(double *)(argInfo + 0xa8)) {
    poVar1 = std::operator<<(local_1a8,", range=");
    toString_abi_cxx11_(&local_238,(Range *)(argInfo + 0xa8));
    std::operator<<(poVar1,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
  }
  if (*(long *)(argInfo + 0xc0) != *(long *)(argInfo + 200)) {
    poVar1 = std::operator<<(local_1a8,", options=(");
    toString<std::__cxx11::string>
              (&local_238,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(argInfo + 0xc0));
    poVar1 = std::operator<<(poVar1,(string *)&local_238);
    std::operator<<(poVar1,")");
    std::__cxx11::string::~string((string *)&local_238);
  }
  std::operator<<(local_1a8,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&replace);
  std::__cxx11::string::~string((string *)&desc);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const SoapySDR::ArgInfo &argInfo, const std::string indent = "    ")
{
    std::stringstream ss;

    //name, or use key if missing
    std::string name = argInfo.name;
    if (argInfo.name.empty()) name = argInfo.key;
    ss << indent << " * " << name;

    //optional description
    std::string desc = argInfo.description;
    const std::string replace("\n"+indent+"   ");
    for (size_t pos = 0; (pos=desc.find("\n", pos)) != std::string::npos; pos+=replace.size())
    {
        desc.replace(pos, 1, replace);
    }
    if (not desc.empty()) ss << " - " << desc << std::endl << indent << "  ";

    //other fields
    ss << " [key=" << argInfo.key;
    if (not argInfo.units.empty()) ss << ", units=" << argInfo.units;
    if (not argInfo.value.empty()) ss << ", default=" << argInfo.value;

    //type
    switch (argInfo.type)
    {
    case SoapySDR::ArgInfo::BOOL: ss << ", type=bool"; break;
    case SoapySDR::ArgInfo::INT: ss << ", type=int"; break;
    case SoapySDR::ArgInfo::FLOAT: ss << ", type=float"; break;
    case SoapySDR::ArgInfo::STRING: ss << ", type=string"; break;
    }

    //optional range/enumeration
    if (argInfo.range.minimum() < argInfo.range.maximum()) ss << ", range=" << toString(argInfo.range);
    if (not argInfo.options.empty()) ss << ", options=(" << toString(argInfo.options) << ")";

    ss << "]";

    return ss.str();
}